

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

result __thiscall
fmt::v6::internal::fixed_handler::on_start
          (fixed_handler *this,uint64_t divisor,uint64_t remainder,uint64_t error,int *exp)

{
  int iVar1;
  result rVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  
  rVar2 = more;
  if (this->fixed == true) {
    iVar4 = this->exp10 + *exp;
    iVar1 = this->precision;
    iVar5 = iVar4 + this->precision;
    this->precision = iVar5;
    if ((iVar5 == 0 || SCARRY4(iVar4,iVar1) != iVar5 < 0) && (rVar2 = done, iVar5 >= 0)) {
      if ((divisor - remainder < remainder) || (cVar3 = '0', divisor + remainder * -2 < error * 2))
      {
        if (remainder < error) {
          return error;
        }
        cVar3 = '1';
        if (remainder - error < divisor - (remainder - error)) {
          return error;
        }
      }
      iVar1 = this->size;
      this->size = iVar1 + 1;
      this->buf[iVar1] = cVar3;
      return done;
    }
  }
  return rVar2;
}

Assistant:

digits::result on_start(uint64_t divisor, uint64_t remainder, uint64_t error,
                          int& exp) {
    // Non-fixed formats require at least one digit and no precision adjustment.
    if (!fixed) return digits::more;
    // Adjust fixed precision by exponent because it is relative to decimal
    // point.
    precision += exp + exp10;
    // Check if precision is satisfied just by leading zeros, e.g.
    // format("{:.2f}", 0.001) gives "0.00" without generating any digits.
    if (precision > 0) return digits::more;
    if (precision < 0) return digits::done;
    auto dir = get_round_direction(divisor, remainder, error);
    if (dir == round_direction::unknown) return digits::error;
    buf[size++] = dir == round_direction::up ? '1' : '0';
    return digits::done;
  }